

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLABecLaplacian.cpp
# Opt level: O1

void __thiscall
amrex::MLABecLaplacian::normalize(MLABecLaplacian *this,int amrlev,int mglev,MultiFab *mf)

{
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  bool bVar27;
  Real dhz;
  Real dhy;
  Real dhx;
  MFIter mfi;
  int local_2cc;
  long local_2c8;
  Box local_1ec;
  Array4<const_double> local_1d0;
  Array4<const_double> local_190;
  Array4<const_double> local_150;
  Array4<double> local_110;
  Array4<const_double> local_d0;
  MFIter local_90;
  
  lVar16 = (long)mglev;
  lVar7 = *(long *)&(this->m_a_coeffs).
                    super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                    .
                    super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[amrlev].
                    super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                    super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>;
  lVar8 = *(long *)&(this->m_b_coeffs).
                    super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                    .
                    super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[amrlev].
                    super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                    .
                    super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
  ;
  lVar11 = *(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_geom.
                     super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[amrlev].
                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  lVar15 = lVar16 * 200;
  dVar2 = *(double *)(lVar11 + 0x38 + lVar15);
  dVar3 = *(double *)(lVar11 + 0x40 + lVar15);
  dVar4 = *(double *)(lVar11 + 0x48 + lVar15);
  dVar5 = this->m_a_scalar;
  dVar6 = this->m_b_scalar;
  uVar10 = (*(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp[5])();
  MFIter::MFIter(&local_90,(FabArrayBase *)mf,true);
  if (local_90.currentIndex < local_90.endIndex) {
    lVar11 = lVar16 * 0x480;
    do {
      MFIter::tilebox(&local_1ec,&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_110,&mf->super_FabArray<amrex::FArrayBox>,&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_d0,(FabArray<amrex::FArrayBox> *)(lVar16 * 0x180 + lVar7),&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_150,(FabArray<amrex::FArrayBox> *)(lVar8 + lVar11),&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_190,(FabArray<amrex::FArrayBox> *)(lVar8 + lVar11 + 0x180),&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_1d0,(FabArray<amrex::FArrayBox> *)(lVar8 + 0x300 + lVar11),&local_90);
      if (0 < (int)uVar10) {
        lVar19 = (long)local_1ec.smallend.vect[1];
        lVar15 = (long)local_1ec.smallend.vect[0] * 8;
        local_2c8 = 0;
        uVar13 = 0;
        do {
          iVar9 = local_1ec.smallend.vect[2];
          local_2cc = local_1ec.smallend.vect[2];
          if (local_1ec.smallend.vect[2] <= local_1ec.bigend.vect[2]) {
            do {
              local_2cc = local_2cc + 1;
              if (local_1ec.smallend.vect[1] <= local_1ec.bigend.vect[1]) {
                lVar25 = (long)iVar9;
                lVar23 = (long)local_150.p +
                         local_150.nstride * local_2c8 +
                         (lVar19 - local_150.begin.y) * local_150.jstride * 8 +
                         (lVar25 - local_150.begin.z) * local_150.kstride * 8 +
                         (long)local_150.begin.x * -8 + lVar15 + 8;
                lVar24 = local_190.jstride * 8;
                lVar1 = local_190.nstride * local_2c8 +
                        (lVar25 - local_190.begin.z) * local_190.kstride * 8;
                lVar21 = (long)local_190.p +
                         (lVar19 - local_190.begin.y) * lVar24 + lVar1 +
                         (long)local_190.begin.x * -8 + lVar15;
                iVar18 = (local_1ec.smallend.vect[1] + 1) - local_190.begin.y;
                lVar17 = local_1d0.jstride * 8;
                lVar14 = (lVar19 - local_1d0.begin.y) * lVar17;
                lVar22 = (long)local_1d0.p +
                         (long)(local_2cc - local_1d0.begin.z) * local_1d0.kstride * 8 + lVar14 +
                         local_1d0.nstride * local_2c8 + (long)local_1d0.begin.x * -8 + lVar15;
                lVar20 = (long)local_1d0.p +
                         (lVar25 - local_1d0.begin.z) * local_1d0.kstride * 8 + lVar14 +
                         local_1d0.nstride * local_2c8 + (long)local_1d0.begin.x * -8 + lVar15;
                lVar12 = (long)local_110.p +
                         local_110.nstride * local_2c8 +
                         (lVar19 - local_110.begin.y) * local_110.jstride * 8 +
                         (lVar25 - local_110.begin.z) * local_110.kstride * 8 +
                         (long)local_110.begin.x * -8 + lVar15;
                lVar25 = (long)local_d0.p +
                         (lVar19 - local_d0.begin.y) * local_d0.jstride * 8 +
                         (lVar25 - local_d0.begin.z) * local_d0.kstride * 8 +
                         (long)local_d0.begin.x * -8 + lVar15;
                lVar14 = lVar19;
                do {
                  if (local_1ec.smallend.vect[0] <= local_1ec.bigend.vect[0]) {
                    lVar26 = 0;
                    do {
                      *(double *)(lVar12 + lVar26 * 8) =
                           *(double *)(lVar12 + lVar26 * 8) /
                           ((*(double *)(lVar20 + lVar26 * 8) + *(double *)(lVar22 + lVar26 * 8)) *
                            dVar6 * dVar4 * dVar4 +
                           (*(double *)(lVar21 + lVar26 * 8) +
                           *(double *)
                            ((long)local_190.p +
                            lVar26 * 8 +
                            iVar18 * lVar24 + lVar1 + (long)local_190.begin.x * -8 + lVar15)) *
                           dVar3 * dVar6 * dVar3 +
                           *(double *)(lVar25 + lVar26 * 8) * dVar5 +
                           (*(double *)(lVar23 + -8 + lVar26 * 8) + *(double *)(lVar23 + lVar26 * 8)
                           ) * dVar2 * dVar6 * dVar2);
                      lVar26 = lVar26 + 1;
                    } while ((local_1ec.bigend.vect[0] - local_1ec.smallend.vect[0]) + 1 !=
                             (int)lVar26);
                  }
                  lVar14 = lVar14 + 1;
                  lVar23 = lVar23 + local_150.jstride * 8;
                  lVar21 = lVar21 + lVar24;
                  iVar18 = iVar18 + 1;
                  lVar22 = lVar22 + lVar17;
                  lVar20 = lVar20 + lVar17;
                  lVar12 = lVar12 + local_110.jstride * 8;
                  lVar25 = lVar25 + local_d0.jstride * 8;
                } while (local_1ec.bigend.vect[1] + 1 != (int)lVar14);
              }
              bVar27 = iVar9 != local_1ec.bigend.vect[2];
              iVar9 = iVar9 + 1;
            } while (bVar27);
          }
          uVar13 = uVar13 + 1;
          local_2c8 = local_2c8 + 8;
        } while (uVar13 != uVar10);
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void
MLABecLaplacian::normalize (int amrlev, int mglev, MultiFab& mf) const
{
    BL_PROFILE("MLABecLaplacian::normalize()");

    const MultiFab& acoef = m_a_coeffs[amrlev][mglev];
    AMREX_D_TERM(const MultiFab& bxcoef = m_b_coeffs[amrlev][mglev][0];,
                 const MultiFab& bycoef = m_b_coeffs[amrlev][mglev][1];,
                 const MultiFab& bzcoef = m_b_coeffs[amrlev][mglev][2];);

    const auto dxinv = m_geom[amrlev][mglev].InvCellSizeArray();

    const Real ascalar = m_a_scalar;
    const Real bscalar = m_b_scalar;

    const int ncomp = getNComp();

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && mf.isFusingCandidate()) {
        const auto& ma = mf.arrays();
        const auto& ama = acoef.const_arrays();
        AMREX_D_TERM(const auto& bxma = bxcoef.const_arrays();,
                     const auto& byma = bycoef.const_arrays();,
                     const auto& bzma = bzcoef.const_arrays(););
        ParallelFor(mf, IntVect(0), ncomp,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            mlabeclap_normalize(i,j,k,n, ma[box_no], ama[box_no],
                                AMREX_D_DECL(bxma[box_no],byma[box_no],bzma[box_no]),
                                dxinv, ascalar, bscalar);
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(mf, TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            const auto& fab = mf.array(mfi);
            const auto& afab = acoef.array(mfi);
            AMREX_D_TERM(const auto& bxfab = bxcoef.array(mfi);,
                         const auto& byfab = bycoef.array(mfi);,
                         const auto& bzfab = bzcoef.array(mfi););

            AMREX_HOST_DEVICE_PARALLEL_FOR_4D(bx, ncomp, i, j, k, n,
            {
                mlabeclap_normalize(i,j,k,n, fab, afab, AMREX_D_DECL(bxfab,byfab,bzfab),
                                    dxinv, ascalar, bscalar);
            });
        }
    }
}